

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O3

int __thiscall input_mod::decode_run(input_mod *this,void *buffer,uint size)

{
  DUMB_IT_SIGRENDERER *pDVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong samples;
  sample_t_conflict *local_30;
  
  iVar5 = 0;
  if (this->eof == false) {
    local_30 = (sample_t_conflict *)buffer;
    pDVar1 = duh_get_it_sigrenderer(this->sr);
    uVar2 = ((long)pDVar1->sub_time_left | (long)pDVar1->time_left << 0x10) /
            (long)(int)(this->delta * 65536.0 + 0.5);
    uVar4 = (ulong)size;
    samples = uVar4;
    if ((long)uVar2 < (long)uVar4) {
      samples = uVar2;
    }
    if (uVar2 == 0) {
      samples = uVar4;
    }
    do {
      dumb_silence(local_30,size * 2);
      lVar3 = render(this,1.0,this->delta,samples,&local_30);
      if (this->eof != false) {
        return 0;
      }
    } while (lVar3 == 0);
    iVar5 = -1;
    if (lVar3 != -1) {
      iVar5 = (int)lVar3;
    }
  }
  return iVar5;
}

Assistant:

int input_mod::decode_run(void *buffer, unsigned int size)
{
	if (eof) return 0;

	DUMB_IT_SIGRENDERER *itsr = duh_get_it_sigrenderer(sr);
	int dt = int(delta * 65536.0 + 0.5);
	long samples = long((((LONG_LONG)itsr->time_left << 16) | itsr->sub_time_left) / dt);
	if (samples == 0 || samples > (long)size) samples = size;
	sample_t **buf = (sample_t **)&buffer;
	int written = 0;

retry:
	dumb_silence(buf[0], size * 2);
	written = render(1, delta, samples, buf);

	if (eof) return false;
	else if (written == 0) goto retry;
	else if (written == -1) return -1;

	return written;
}